

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O3

int ExorLinkCubeIteratorNext(Cube **pGroup)

{
  int iVar1;
  drow *pdVar2;
  drow *pdVar3;
  Cube *pCVar4;
  int iVar5;
  Cube *pCVar6;
  uint uVar7;
  drow dVar8;
  long lVar9;
  long lVar10;
  drow *pdVar11;
  byte bVar12;
  long lVar13;
  int iVar14;
  int (*paiVar15) [3];
  uint uVar16;
  long lVar17;
  
  if (fWorking == '\0') {
    __assert_fail("fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                  ,0x237,"int ExorLinkCubeIteratorNext(Cube **)");
  }
  if (nVisitedGroups != nGroups) {
    if (0 < nGroups) {
      iVar5 = -1;
      lVar10 = 0;
      iVar14 = 0;
      do {
        if (((*(uint *)((long)s_BitMasks + lVar10) & VisitedGroups) == 0) &&
           (iVar5 < *(int *)((long)GroupCosts + lVar10))) {
          GroupCostBestNum = iVar14;
          iVar5 = *(int *)((long)GroupCosts + lVar10);
        }
        iVar14 = iVar14 + 1;
        lVar10 = lVar10 + 4;
      } while ((ulong)(uint)nGroups << 2 != lVar10);
      if (iVar5 != -1) {
        LastGroup = 0;
        iVar5 = GroupCostBestNum;
        if (0 < nCubes) {
          dVar8 = 0;
          lVar10 = 0;
          iVar14 = nDist;
          do {
            CubeNum = s_ELGroupRules[iVar14][iVar5][lVar10];
            dVar8 = dVar8 | s_BitMasks[CubeNum];
            pCVar6 = ELCubes[CubeNum];
            LastGroup = dVar8;
            if (pCVar6 == (Cube *)0x0) {
              pCVar6 = GetFreeCube();
              lVar9 = (long)CubeNum;
              ELCubes[lVar9] = pCVar6;
              if (0 < g_CoverInfo.nWordsIn) {
                pdVar2 = pCVar6->pCubeDataIn;
                pdVar11 = DammyBitData;
                lVar13 = 0;
                do {
                  pdVar2[lVar13] = *pdVar11;
                  lVar13 = lVar13 + 1;
                  pdVar11 = pdVar11 + 1;
                } while (lVar13 < g_CoverInfo.nWordsIn);
              }
              uVar7 = nDiffVarsIn;
              pCVar4 = pCA;
              NewZ = 0;
              if (DiffVars[0] < 0) {
                iVar5 = s_ELCubeRules[nDist][lVar9][nDiffVarsIn];
                if (iVar5 == 0) {
                  if (0 < g_CoverInfo.nWordsOut) {
                    pdVar2 = pCA->pCubeDataOut;
                    pdVar11 = pCVar6->pCubeDataOut;
                    lVar13 = 0;
                    NewZ = 0;
                    do {
                      uVar16 = pdVar2[lVar13];
                      pdVar11[lVar13] = uVar16;
                      NewZ = NewZ + (uint)BitCount[uVar16 >> 0x10] + (uint)BitCount[uVar16 & 0xffff]
                      ;
                      lVar13 = lVar13 + 1;
                    } while (lVar13 < g_CoverInfo.nWordsOut);
                  }
                }
                else if (iVar5 == 1) {
                  if (0 < g_CoverInfo.nWordsOut) {
                    pdVar2 = pCB->pCubeDataOut;
                    pdVar11 = pCVar6->pCubeDataOut;
                    lVar13 = 0;
                    NewZ = 0;
                    do {
                      uVar16 = pdVar2[lVar13];
                      pdVar11[lVar13] = uVar16;
                      NewZ = NewZ + (uint)BitCount[uVar16 >> 0x10] + (uint)BitCount[uVar16 & 0xffff]
                      ;
                      lVar13 = lVar13 + 1;
                    } while (lVar13 < g_CoverInfo.nWordsOut);
                  }
                }
                else if ((iVar5 == 2) && (0 < g_CoverInfo.nWordsOut)) {
                  pdVar2 = pCA->pCubeDataOut;
                  pdVar11 = pCB->pCubeDataOut;
                  pdVar3 = pCVar6->pCubeDataOut;
                  lVar13 = 0;
                  NewZ = 0;
                  do {
                    uVar16 = pdVar11[lVar13] ^ pdVar2[lVar13];
                    pdVar3[lVar13] = uVar16;
                    NewZ = NewZ + (uint)BitCount[uVar16 >> 0x10] + (uint)BitCount[uVar16 & 0xffff];
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < g_CoverInfo.nWordsOut);
                }
              }
              else {
                if (0 < g_CoverInfo.nWordsOut) {
                  pdVar2 = pCA->pCubeDataOut;
                  pdVar11 = pCVar6->pCubeDataOut;
                  lVar13 = 0;
                  do {
                    pdVar11[lVar13] = pdVar2[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < g_CoverInfo.nWordsOut);
                }
                NewZ = (int)pCVar4->z;
                uVar7 = nDiffVarsIn;
              }
              iVar5 = NewZ;
              if (0 < (int)uVar7) {
                lVar13 = (long)nDist;
                pdVar2 = pCVar6->pCubeDataIn;
                paiVar15 = DiffVarValues;
                lVar17 = 0;
                do {
                  pdVar2[*(int *)((long)DiffVarWords + lVar17)] =
                       pdVar2[*(int *)((long)DiffVarWords + lVar17)] |
                       (*paiVar15)[*(int *)((long)s_ELCubeRules[lVar13][lVar9] + lVar17)] <<
                       (*(byte *)((long)DiffVarBits + lVar17) & 0x1f);
                  lVar17 = lVar17 + 4;
                  paiVar15 = paiVar15 + 1;
                } while ((ulong)uVar7 << 2 != lVar17);
              }
              pCVar6->a = (short)CubeLiterals[lVar9] + (short)StartingLiterals;
              pCVar6->z = (short)iVar5;
              iVar5 = ComputeQCostBits(pCVar6);
              pCVar6 = ELCubes[CubeNum];
              pCVar6->q = (short)iVar5;
              dVar8 = LastGroup;
              iVar5 = GroupCostBestNum;
              iVar14 = nDist;
              if (NewZ == 0xff) {
                __assert_fail("NewZ != 255",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                              ,0x295,"int ExorLinkCubeIteratorNext(Cube **)");
              }
              iVar1 = g_CoverInfo.cIDs + 1;
              bVar12 = (byte)g_CoverInfo.cIDs;
              g_CoverInfo.cIDs = iVar1;
              pCVar6->ID = bVar12;
              if (iVar1 == 0x100) {
                g_CoverInfo.cIDs = 1;
              }
            }
            pGroup[lVar10] = pCVar6;
            lVar10 = lVar10 + 1;
          } while (lVar10 < nCubes);
        }
        VisitedGroups = VisitedGroups | s_BitMasks[iVar5];
        lVar10 = (long)nVisitedGroups;
        nVisitedGroups = nVisitedGroups + 1;
        GroupOrder[lVar10] = iVar5;
        return 1;
      }
    }
    __assert_fail("GroupCostBest != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                  ,0x255,"int ExorLinkCubeIteratorNext(Cube **)");
  }
  return 0;
}

Assistant:

int ExorLinkCubeIteratorNext( Cube** pGroup )
// give the next group in the decreasing order of sum of literals
// returns 1 on success, returns 0 if there are no more groups
{
    int i, c;

    // check that everything is okey
    assert( fWorking );

    if ( nVisitedGroups == nGroups ) 
    // we have iterated through all groups
        return 0;

    // find the min/max cost group
    if ( fMinLitGroupsFirst[nDist] ) 
//  if ( nCubes == 4 ) 
    { // find the minimum cost
        // go through all groups
        GroupCostBest = LARGE_NUM;
        for ( i = 0; i < nGroups; i++ )
            if ( !(VisitedGroups & s_BitMasks[i]) && GroupCostBest > GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
        assert( GroupCostBest != LARGE_NUM );
    }
    else 
    { // find the maximum cost
        // go through all groups
        GroupCostBest = -1;
        for ( i = 0; i < nGroups; i++ )
            if ( !(VisitedGroups & s_BitMasks[i]) && GroupCostBest < GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
        assert( GroupCostBest != -1 );
    }

    // create the cubes needed for the group, if they are not created already
    LastGroup = 0;
    for ( c = 0; c < nCubes; c++ )
    {
        CubeNum = s_ELGroupRules[nDist][GroupCostBestNum][c];
        LastGroup |= s_BitMasks[CubeNum];

        if ( ELCubes[CubeNum] == NULL ) // this cube does not exist
        {
            // bring a cube from the free cube list
            ELCubes[CubeNum] = GetFreeCube();

            // copy the input bit data into the cube 
            for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
                ELCubes[CubeNum]->pCubeDataIn[i] = DammyBitData[i];

            // copy the output bit data into the cube
            NewZ = 0;
            if ( DiffVars[0] >= 0 ) // the output is not involved in ExorLink
            {
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    ELCubes[CubeNum]->pCubeDataOut[i] = pCA->pCubeDataOut[i];
                NewZ = pCA->z;
            }
            else // the output is involved
            { // determine where the output information comes from
                Value = s_ELCubeRules[nDist][CubeNum][nDiffVarsIn];
                if ( Value == vs0 )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCA->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
                else if ( Value == vs1 )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCB->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
                else if ( Value == vsX )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCA->pCubeDataOut[i] ^ pCB->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
            }

            // set the variables that should be there
            for ( i = 0; i < nDiffVarsIn; i++ )
            {
                Value = DiffVarValues[i][ s_ELCubeRules[nDist][CubeNum][i] ];
                ELCubes[CubeNum]->pCubeDataIn[ DiffVarWords[i] ] |= ( Value << DiffVarBits[i] );
            }

            // set the number of literals and output ones
            ELCubes[CubeNum]->a = StartingLiterals + CubeLiterals[CubeNum];
            ELCubes[CubeNum]->z = NewZ;
            ELCubes[CubeNum]->q = ComputeQCostBits( ELCubes[CubeNum] );
            assert( NewZ != 255 );

            // assign the ID
            ELCubes[CubeNum]->ID = g_CoverInfo.cIDs++;
            // skip through zero-ID
            if ( g_CoverInfo.cIDs == 256 )
                g_CoverInfo.cIDs = 1;

        }
        // prepare the return array
        pGroup[c] = ELCubes[CubeNum];
    }

    // mark this group as visited 
    VisitedGroups |= s_BitMasks[ GroupCostBestNum ];
    // set the next visited group number and
    // increment the counter of visited groups
    GroupOrder[ nVisitedGroups++ ] = GroupCostBestNum;
    return 1;
}